

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stdout_sinks-inl.h
# Opt level: O2

void __thiscall
spdlog::sinks::stdout_sink<spdlog::details::console_nullmutex>::stdout_sink
          (stdout_sink<spdlog::details::console_nullmutex> *this)

{
  stdout_sink_base<spdlog::details::console_nullmutex>::stdout_sink_base
            (&this->super_stdout_sink_base<spdlog::details::console_nullmutex>,_stdout);
  (this->super_stdout_sink_base<spdlog::details::console_nullmutex>).super_sink._vptr_sink =
       (_func_int **)&PTR__stdout_sink_base_0019bed8;
  return;
}

Assistant:

SPDLOG_INLINE stdout_sink<ConsoleMutex>::stdout_sink()
    : stdout_sink_base<ConsoleMutex>(stdout) {}